

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O2

Tile * __thiscall Tile::flipY(Tile *this)

{
  bool bVar1;
  bool bVar2;
  Tile *pTVar3;
  Tile *pTVar4;
  uchar *puVar5;
  int x;
  long lVar6;
  uchar *puVar7;
  long lVar8;
  
  pTVar4 = (Tile *)operator_new(0x50);
  bVar1 = this->flipped_x;
  bVar2 = this->is_duplicate;
  pTVar3 = this->original_tile;
  pTVar4->id = this->id;
  pTVar4->flipped_x = bVar1;
  pTVar4->flipped_y = true;
  pTVar4->is_duplicate = bVar2;
  pTVar4->original_tile = pTVar3;
  puVar5 = pTVar4->data;
  for (lVar6 = 0; puVar7 = puVar5, lVar8 = 8, lVar6 != 8; lVar6 = lVar6 + 1) {
    while (lVar8 != 0) {
      *puVar7 = this->data[lVar8 * 8 + -8];
      puVar7 = puVar7 + 8;
      lVar8 = lVar8 + -1;
    }
    this = (Tile *)((long)&this->id + 1);
    puVar5 = puVar5 + 1;
  }
  return pTVar4;
}

Assistant:

Tile *Tile::flipY() {
    Tile *flipped_tile = new Tile(id, flipped_x, true, is_duplicate, original_tile);

    for (int x = 0; x < TILE_WIDTH; x++) {
        for (int y = 0; y < TILE_HEIGHT; y++) {
            flipped_tile->data[y * TILE_WIDTH + x] = data[(TILE_HEIGHT - 1 - y) * TILE_WIDTH + x];
        }
    }

    return flipped_tile;
}